

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  long in_FS_OFFSET;
  TimeInMillis ms_local;
  int local_230;
  allocator<char> local_229;
  undefined1 local_228 [8];
  tm time_struct;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = PortableLocaltime((long)this / 1000,(tm *)local_228);
  if (bVar1) {
    local_230 = time_struct.tm_mday + 0x76c;
    StreamableToString<int>(&local_150,&local_230);
    std::operator+(&local_130,&local_150,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_170,(String *)(ulong)(time_struct.tm_hour + 1),value);
    std::operator+(&local_110,&local_130,&local_170);
    std::operator+(&local_f0,&local_110,"-");
    String::FormatIntWidth2_abi_cxx11_
              (&local_190,(String *)(ulong)(uint)time_struct.tm_min,value_00);
    std::operator+(&local_d0,&local_f0,&local_190);
    std::operator+(&local_b0,&local_d0,"T");
    String::FormatIntWidth2_abi_cxx11_
              (&local_1b0,(String *)(ulong)(uint)time_struct.tm_sec,value_01);
    std::operator+(&local_90,&local_b0,&local_1b0);
    std::operator+(&local_70,&local_90,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1d0,(String *)(ulong)(uint)local_228._4_4_,value_02);
    std::operator+(&local_50,&local_70,&local_1d0);
    std::operator+(&local_30,&local_50,":");
    String::FormatIntWidth2_abi_cxx11_
              ((string *)&time_struct.tm_zone,(String *)(ulong)(uint)local_228._0_4_,value_03);
    std::operator+(__return_storage_ptr__,&local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &time_struct.tm_zone);
    std::__cxx11::string::~string((string *)&time_struct.tm_zone);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_229);
    std::allocator<char>::~allocator(&local_229);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}